

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  ImVec2 *local_70;
  ImVec2 *local_50;
  int local_48;
  int local_44;
  int i_3;
  int i_2;
  int i_1;
  ImVec2 local_34;
  ImVec2 local_2c;
  ImVec2 local_24;
  int local_1c;
  ImVec2 IStack_18;
  int i;
  ImGuiIO *local_10;
  ImGuiIO *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->DisplaySize);
  ImVec2::ImVec2(&this->DisplayFramebufferScale);
  ImVec2::ImVec2(&this->DisplayVisibleMin);
  ImVec2::ImVec2(&this->DisplayVisibleMax);
  ImVec2::ImVec2(&this->MousePos);
  ImVec2::ImVec2(&this->MouseDelta);
  ImVec2::ImVec2(&this->MousePosPrev);
  local_50 = this->MouseClickedPos;
  do {
    ImVec2::ImVec2(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (ImVec2 *)this->MouseClickedTime);
  local_70 = this->MouseDragMaxDistanceAbs;
  do {
    ImVec2::ImVec2(local_70);
    local_70 = local_70 + 1;
  } while (local_70 != (ImVec2 *)this->MouseDragMaxDistanceSqr);
  memset(this,0,0x1518);
  this->ConfigFlags = 0;
  this->BackendFlags = 0;
  ImVec2::ImVec2(&stack0xffffffffffffffe8,-1.0,-1.0);
  this->DisplaySize = IStack_18;
  this->DeltaTime = 0.016666668;
  this->IniSavingRate = 5.0;
  this->IniFilename = "imgui.ini";
  this->LogFilename = "imgui_log.txt";
  this->MouseDoubleClickTime = 0.3;
  this->MouseDoubleClickMaxDist = 6.0;
  for (local_1c = 0; local_1c < 0x15; local_1c = local_1c + 1) {
    this->KeyMap[local_1c] = -1;
  }
  this->KeyRepeatDelay = 0.25;
  this->KeyRepeatRate = 0.05;
  this->UserData = (void *)0x0;
  this->Fonts = (ImFontAtlas *)0x0;
  this->FontGlobalScale = 1.0;
  this->FontDefault = (ImFont *)0x0;
  this->FontAllowUserScaling = false;
  ImVec2::ImVec2(&local_24,1.0,1.0);
  this->DisplayFramebufferScale = local_24;
  ImVec2::ImVec2(&local_2c,0.0,0.0);
  this->DisplayVisibleMax = local_2c;
  this->DisplayVisibleMin = this->DisplayVisibleMax;
  this->OptMacOSXBehaviors = false;
  this->OptCursorBlink = true;
  this->GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;
  this->SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
  this->ClipboardUserData = (void *)0x0;
  this->ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
  this->ImeWindowHandle = (void *)0x0;
  this->RenderDrawListsFn = (_func_void_ImDrawData_ptr *)0x0;
  ImVec2::ImVec2(&local_34,-3.4028235e+38,-3.4028235e+38);
  this->MousePos = local_34;
  ImVec2::ImVec2((ImVec2 *)&i_2,-3.4028235e+38,-3.4028235e+38);
  this->MousePosPrev = _i_2;
  this->MouseDragThreshold = 6.0;
  for (i_3 = 0; i_3 < 5; i_3 = i_3 + 1) {
    this->MouseDownDurationPrev[i_3] = -1.0;
    this->MouseDownDuration[i_3] = -1.0;
  }
  for (local_44 = 0; local_44 < 0x200; local_44 = local_44 + 1) {
    this->KeysDownDurationPrev[local_44] = -1.0;
    this->KeysDownDuration[local_44] = -1.0;
  }
  for (local_48 = 0; local_48 < 0x15; local_48 = local_48 + 1) {
    this->NavInputsDownDuration[local_48] = -1.0;
  }
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));

    // Settings
    ConfigFlags = 0x00;
    BackendFlags = 0x00;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f/60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini";
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
    KeyRepeatDelay = 0.250f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);
    DisplayVisibleMin = DisplayVisibleMax = ImVec2(0.0f, 0.0f);

    // Advanced/subtle behaviors
#ifdef __APPLE__
    OptMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    OptMacOSXBehaviors = false;
#endif
    OptCursorBlink = true;

    // Settings (User Functions)
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
    ImeWindowHandle = NULL;

#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    RenderDrawListsFn = NULL;
#endif

    // Input (NB: we already have memset zero the entire structure)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysDownDuration); i++) KeysDownDuration[i]  = KeysDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
}